

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voxelizer.h
# Opt level: O3

float vx__triangle_area(vx_triangle_t *triangle)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  
  fVar7 = (triangle->p2).field_0.v[2] - (triangle->p1).field_0.v[2];
  uVar1 = *(undefined8 *)&(triangle->p1).field_0;
  uVar2 = *(undefined8 *)((long)&(triangle->p1).field_0 + 4);
  uVar3 = *(undefined8 *)&(triangle->p2).field_0;
  uVar4 = *(undefined8 *)((long)&(triangle->p3).field_0 + 4);
  fVar10 = (float)uVar4 - (float)uVar2;
  fVar11 = (float)((ulong)uVar4 >> 0x20) - (float)((ulong)uVar2 >> 0x20);
  fVar8 = (float)uVar1;
  fVar5 = (float)uVar3 - fVar8;
  fVar6 = (float)((ulong)uVar3 >> 0x20) - (float)((ulong)uVar1 >> 0x20);
  fVar8 = (triangle->p3).field_0.v[0] - fVar8;
  fVar9 = fVar7 * fVar8 - fVar11 * fVar5;
  fVar5 = fVar5 * fVar10 - fVar8 * fVar6;
  fVar6 = fVar6 * fVar11 - fVar10 * fVar7;
  return SQRT(fVar6 * fVar6 + fVar9 * fVar9 + fVar5 * fVar5) * 0.5;
}

Assistant:

float vx__triangle_area(vx_triangle_t* triangle) {
    vx_vertex_t ab = triangle->p2;
    vx_vertex_t ac = triangle->p3;

    vx__vertex_sub(&ab, &triangle->p1);
    vx__vertex_sub(&ac, &triangle->p1);

    float a0 = ab.y * ac.z - ab.z * ac.y;
    float a1 = ab.z * ac.x - ab.x * ac.z;
    float a2 = ab.x * ac.y - ab.y * ac.x;

    return sqrtf(powf(a0, 2.f) + powf(a1, 2.f) + powf(a2, 2.f)) * 0.5f;
}